

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_entrypt(CVmImageLoader *this,ulong siz)

{
  int iVar1;
  unsigned_long uVar2;
  ulong in_RSI;
  CVmRun *in_RDI;
  char buf [32];
  ulong *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  CVmImageLoader *in_stack_ffffffffffffffd0;
  
  if (((byte)in_RDI[1].funchdr_size_ >> 2 & 1) != 0) {
    err_throw(0);
  }
  read_data(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_RDI,
            in_stack_ffffffffffffffb8);
  uVar2 = ::osrp4(&stack0xffffffffffffffc8);
  *(int *)&in_RDI->field_0x3c = (int)uVar2;
  ::osrp2(&stack0xffffffffffffffcc);
  CVmRun::set_funchdr_size(in_RDI,(size_t)in_stack_ffffffffffffffb8);
  iVar1 = ::osrp2(&stack0xffffffffffffffce);
  G_exc_entry_size_X = (size_t)iVar1;
  iVar1 = ::osrp2(&stack0xffffffffffffffd0);
  G_line_entry_size_X = (size_t)iVar1;
  iVar1 = ::osrp2(&stack0xffffffffffffffd2);
  G_dbg_hdr_size_X = (size_t)iVar1;
  iVar1 = ::osrp2(&stack0xffffffffffffffd4);
  G_dbg_lclsym_hdr_size_X = (size_t)iVar1;
  G_dbg_fmt_vsn_X = ::osrp2(&stack0xffffffffffffffd6);
  G_dbg_frame_size_X = 4;
  if (1 < in_RSI) {
    read_data(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_RDI,
              in_stack_ffffffffffffffb8);
    G_dbg_frame_size_X = ::osrp2(&stack0xffffffffffffffc8);
  }
  *(byte *)&in_RDI[1].funchdr_size_ = (byte)in_RDI[1].funchdr_size_ & 0xfb | 4;
  return;
}

Assistant:

void CVmImageLoader::load_entrypt(VMG_ ulong siz)
{
    char buf[32];
    
    /* if we've already loaded an entrypoint, throw an error */
    if (loaded_entrypt_)
        err_throw(VMERR_IMAGE_ENTRYPT_REDEF);

    /* read the entrypoint offset */
    read_data(buf, 16, &siz);

    /* set the entrypoint */
    entrypt_ = t3rp4u(buf);

    /* set the method header size in the interpreter */
    G_interpreter->set_funchdr_size(osrp2(buf+4));

    /* set the exception table entry size global */
    G_exc_entry_size = osrp2(buf+6);

    /* set the debugger source line record size global */
    G_line_entry_size = osrp2(buf+8);

    /* set the debug table header size */
    G_dbg_hdr_size = osrp2(buf+10);

    /* set the debug local symbol header size */
    G_dbg_lclsym_hdr_size = osrp2(buf+12);

    /* set the debug version ID */
    G_dbg_fmt_vsn = osrp2(buf+14);

    /* set the frame size */
    G_dbg_frame_size = 4;
    if (siz >= 2)
    {
        read_data(buf, 2, &siz);
        G_dbg_frame_size = osrp2(buf);
    }

    /* note that we've loaded it */
    loaded_entrypt_ = TRUE;
}